

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O2

int lj_sysprof_stop(lua_State *L)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (sysprof.state == 0) {
    iVar1 = 2;
  }
  else if (sysprof.g == (global_State *)(ulong)(L->glref).ptr32) {
    lj_profile_timer_stop(&sysprof.timer);
    iVar1 = sysprof.saved_errno;
    if (sysprof.state == 2) {
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      sysprof.state = 0;
    }
    else {
      sysprof.state = 0;
      if (sysprof.opt.mode == '\0') {
        sysprof.state = 0;
        return 0;
      }
      lj_wbuf_addbyte(&sysprof.out,0x80);
      lj_wbuf_flush(&sysprof.out);
      iVar1 = (*sysprof.on_stop)(sysprof.opt.ctx,sysprof.out.buf);
      iVar2 = lj_wbuf_test_flag(&sysprof.out,'\x03');
      if (iVar2 == 0 && iVar1 == 0) {
        lj_wbuf_terminate(&sysprof.out);
        return 0;
      }
      iVar1 = lj_wbuf_errno(&sysprof.out);
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      lj_wbuf_terminate(&sysprof.out);
    }
    iVar1 = 4;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int lj_sysprof_stop(lua_State *L)
{
  struct sysprof *sp = &sysprof;
  global_State *g = sp->g;
  struct lj_wbuf *out = &sp->out;

  if (SPS_IDLE == sp->state)
    return PROFILE_ERRRUN;
  else if (G(L) != g)
    return PROFILE_ERRUSE;

  lj_profile_timer_stop(&sp->timer);

  if (SPS_HALT == sp->state) {
    errno = sp->saved_errno;
    sp->state = SPS_IDLE;
    /* wbuf was terminated when error occurred. */
    return PROFILE_ERRIO;
  }

  sp->state = SPS_IDLE;

  if (stream_is_needed(sp)) {
    int cb_status = 0;

    stream_epilogue(sp);
    lj_wbuf_flush(out);

    cb_status = sp->on_stop(sp->opt.ctx, out->buf);
    if (LJ_UNLIKELY(lj_wbuf_test_flag(out, STREAM_ERRIO | STREAM_STOP)) ||
        cb_status != 0) {
      errno = lj_wbuf_errno(out);
      lj_wbuf_terminate(out);
      return PROFILE_ERRIO;
    }

    lj_wbuf_terminate(out);
  }

  return PROFILE_SUCCESS;
}